

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::udiv(APInt *this,uint64_t RHS)

{
  bool bVar1;
  uint uVar2;
  ulong in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar3;
  APInt AVar4;
  ulong uStack_20;
  uint lhsWords;
  uint64_t RHS_local;
  APInt *this_local;
  APInt *Quotient;
  
  RHS_local = RHS;
  this_local = this;
  if (in_RDX == 0) {
    __assert_fail("RHS != 0 && \"Divide by zero?\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x621,"APInt llvm::APInt::udiv(uint64_t) const");
  }
  uStack_20 = in_RDX;
  bVar1 = isSingleWord((APInt *)RHS);
  if (bVar1) {
    APInt(this,*(uint *)(RHS + 8),*(ulong *)RHS / uStack_20,false);
    uVar3 = extraout_RDX;
  }
  else {
    uVar2 = getActiveBits((APInt *)RHS);
    uVar2 = getNumWords(uVar2);
    if (uVar2 == 0) {
      APInt(this,*(uint *)(RHS + 8),0,false);
      uVar3 = extraout_RDX_00;
    }
    else if (uStack_20 == 1) {
      APInt(this,(APInt *)RHS);
      uVar3 = extraout_RDX_01;
    }
    else {
      bVar1 = ult((APInt *)RHS,uStack_20);
      if (bVar1) {
        APInt(this,*(uint *)(RHS + 8),0,false);
        uVar3 = extraout_RDX_02;
      }
      else {
        bVar1 = operator==((APInt *)RHS,uStack_20);
        if (bVar1) {
          APInt(this,*(uint *)(RHS + 8),1,false);
          uVar3 = extraout_RDX_03;
        }
        else if (uVar2 == 1) {
          APInt(this,*(uint *)(RHS + 8),**(ulong **)RHS / uStack_20,false);
          uVar3 = extraout_RDX_04;
        }
        else {
          APInt(this,*(uint *)(RHS + 8),0,false);
          divide(*(WordType **)RHS,uVar2,&stack0xffffffffffffffe0,1,(this->U).pVal,(WordType *)0x0);
          uVar3 = extraout_RDX_05;
        }
      }
    }
  }
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::udiv(uint64_t RHS) const {
  assert(RHS != 0 && "Divide by zero?");

  // First, deal with the easy case
  if (isSingleWord())
    return APInt(BitWidth, U.VAL / RHS);

  // Get some facts about the LHS words.
  unsigned lhsWords = getNumWords(getActiveBits());

  // Deal with some degenerate cases
  if (!lhsWords)
    // 0 / X ===> 0
    return APInt(BitWidth, 0);
  if (RHS == 1)
    // X / 1 ===> X
    return *this;
  if (this->ult(RHS))
    // X / Y ===> 0, iff X < Y
    return APInt(BitWidth, 0);
  if (*this == RHS)
    // X / X ===> 1
    return APInt(BitWidth, 1);
  if (lhsWords == 1) // rhsWords is 1 if lhsWords is 1.
    // All high words are zero, just use native divide
    return APInt(BitWidth, this->U.pVal[0] / RHS);

  // We have to compute it the hard way. Invoke the Knuth divide algorithm.
  APInt Quotient(BitWidth, 0); // to hold result.
  divide(U.pVal, lhsWords, &RHS, 1, Quotient.U.pVal, nullptr);
  return Quotient;
}